

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O1

bool __thiscall HEkkDual::checkNonUnitWeightError(HEkkDual *this,string *message)

{
  long lVar1;
  bool bVar2;
  double dVar3;
  
  if (this->edge_weight_mode == kDantzig) {
    if ((long)this->solver_num_row < 1) {
      dVar3 = 0.0;
    }
    else {
      dVar3 = 0.0;
      lVar1 = 0;
      do {
        dVar3 = dVar3 + ABS((this->ekk_instance_->dual_edge_weight_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar1] + -1.0);
        lVar1 = lVar1 + 1;
      } while (this->solver_num_row != lVar1);
    }
    bVar2 = 0.0001 < dVar3;
    if (0.0001 < dVar3) {
      bVar2 = true;
      printf("Non-unit Edge weight error of %g: %s\n",(message->_M_dataplus)._M_p);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HEkkDual::checkNonUnitWeightError(std::string message) {
  bool error_found = false;
  if (edge_weight_mode == EdgeWeightMode::kDantzig) {
    std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
    double unit_wt_error = 0;
    for (HighsInt iRow = 0; iRow < solver_num_row; iRow++) {
      unit_wt_error += fabs(edge_weight[iRow] - 1.0);
    }
    error_found = unit_wt_error > 1e-4;
    if (error_found)
      printf("Non-unit Edge weight error of %g: %s\n", unit_wt_error,
             message.c_str());
  }
  return error_found;
}